

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
::~CartesianProductGenerator
          (CartesianProductGenerator<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
           *this)

{
  (this->
  super_ParamGeneratorInterface<std::tuple<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  )._vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_00f63c10;
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<BLOCK_SIZE>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  ::~_Tuple_impl(&(this->generators_).
                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<BLOCK_SIZE>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                );
  return;
}

Assistant:

~CartesianProductGenerator() override {}